

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaeValidator.cpp
# Opt level: O0

int __thiscall opencollada::DaeValidator::checkUniqueSids(DaeValidator *this,Dae *dae)

{
  bool bVar1;
  ostream *poVar2;
  XmlNodeSet *pXVar3;
  pointer ppVar4;
  Dae *in_RSI;
  iterator iVar5;
  iterator it;
  size_t line;
  string sid;
  XmlNode child;
  iterator __end2;
  iterator __begin2;
  XmlNodeSet *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  sids;
  XmlNodeSet *children;
  XmlNode parent;
  iterator __end1;
  iterator __begin1;
  XmlNodeSet *__range1;
  XmlNodeSet *parents;
  int result;
  XmlNodeSet in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd80;
  iterator *in_stack_fffffffffffffd88;
  key_type *in_stack_fffffffffffffdb8;
  ostream *in_stack_fffffffffffffdc0;
  _Self local_1c8;
  _Self local_1c0;
  Uri *local_1b8;
  allocator local_1a9;
  string local_1a8 [32];
  xmlAttrPtr local_188;
  string local_180 [32];
  XmlNode local_160;
  xmlNodeSetPtr local_158;
  int local_150;
  xmlNodeSetPtr local_148;
  int in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  xmlNodeSetPtr in_stack_fffffffffffffec8;
  iterator local_128;
  XmlNodeSet *local_118;
  allocator local_d9;
  string local_d8 [32];
  XmlNodeSet *local_b8;
  xmlNodePtr local_b0;
  xmlNodeSetPtr local_a8;
  int local_a0;
  iterator local_98;
  xmlNodeSetPtr local_88;
  int local_80;
  iterator local_78;
  XmlNodeSet *local_68;
  allocator local_49;
  string local_48 [32];
  xmlNodePtr local_28;
  XmlNodeSet *local_20;
  uint local_14;
  Dae *local_10;
  
  local_10 = in_RSI;
  poVar2 = ::std::operator<<((ostream *)&::std::cout,"Checking unique sids...");
  ::std::ostream::operator<<(poVar2,::std::endl<char,std::char_traits<char>>);
  local_14 = 0;
  local_28 = (xmlNodePtr)XmlDoc::root((XmlDoc *)in_stack_fffffffffffffd78.mXPathObject);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_48,"//*[@sid]/..",&local_49);
  pXVar3 = XmlNode::selectNodes
                     ((XmlNode *)in_stack_fffffffffffffec8,
                      (string *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  ::std::__cxx11::string::~string(local_48);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68 = pXVar3;
  local_20 = pXVar3;
  iVar5 = XmlNodeSet::begin((XmlNodeSet *)in_stack_fffffffffffffd80);
  local_88 = iVar5.mNodeSet;
  local_80 = iVar5.mIndex;
  local_78.mNodeSet = local_88;
  local_78.mIndex = local_80;
  iVar5 = XmlNodeSet::end((XmlNodeSet *)in_stack_fffffffffffffd78.mXPathObject);
  local_a8 = iVar5.mNodeSet;
  local_a0 = iVar5.mIndex;
  local_98.mNodeSet = local_a8;
  local_98.mIndex = local_a0;
  while( true ) {
    bVar1 = XmlNodeSet::iterator::operator!=(&local_78,&local_98);
    if (!bVar1) break;
    local_b0 = (xmlNodePtr)XmlNodeSet::iterator::operator*(in_stack_fffffffffffffd88);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_d8,"*[@sid]",&local_d9);
    pXVar3 = XmlNode::selectNodes
                       ((XmlNode *)in_stack_fffffffffffffec8,
                        (string *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    ::std::__cxx11::string::~string(local_d8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    local_b8 = pXVar3;
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *)0x1862a5);
    local_118 = local_b8;
    iVar5 = XmlNodeSet::begin((XmlNodeSet *)in_stack_fffffffffffffd80);
    in_stack_fffffffffffffec8 = iVar5.mNodeSet;
    local_128.mIndex = iVar5.mIndex;
    local_128.mNodeSet = in_stack_fffffffffffffec8;
    iVar5 = XmlNodeSet::end((XmlNodeSet *)in_stack_fffffffffffffd78.mXPathObject);
    local_158 = iVar5.mNodeSet;
    local_150 = iVar5.mIndex;
    local_148 = local_158;
    in_stack_fffffffffffffec0 = local_150;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=(&local_128,(iterator *)&local_148);
      if (!bVar1) break;
      local_160 = XmlNodeSet::iterator::operator*(in_stack_fffffffffffffd88);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1a8,"sid",&local_1a9);
      local_188 = (xmlAttrPtr)
                  XmlNode::attribute((XmlNode *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80)
      ;
      XmlAttribute::value_abi_cxx11_((XmlAttribute *)in_stack_fffffffffffffdb8);
      ::std::__cxx11::string::~string(local_1a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      local_1b8 = (Uri *)XmlNode::line(&local_160);
      local_1c0._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)in_stack_fffffffffffffd78.mXPathObject,(key_type *)0x186475);
      local_1c8._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)in_stack_fffffffffffffd78.mXPathObject);
      bVar1 = ::std::operator!=(&local_1c0,&local_1c8);
      if (bVar1) {
        Dae::getURI(local_10);
        in_stack_fffffffffffffdc0 =
             operator<<((ostream *)in_stack_fffffffffffffd80,
                        (Uri *)in_stack_fffffffffffffd78.mXPathObject);
        in_stack_fffffffffffffdb8 = (key_type *)::std::operator<<(in_stack_fffffffffffffdc0,":");
        poVar2 = (ostream *)::std::ostream::operator<<(in_stack_fffffffffffffdb8,(ulong)local_1b8);
        poVar2 = ::std::operator<<(poVar2,": Duplicated sid \"");
        poVar2 = ::std::operator<<(poVar2,local_180);
        poVar2 = ::std::operator<<(poVar2,"\". See first declaration at line ");
        ppVar4 = ::std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                               *)0x18656f);
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,ppVar4->second);
        in_stack_fffffffffffffd88 = (iterator *)::std::operator<<(poVar2,".");
        ::std::ostream::operator<<
                  (in_stack_fffffffffffffd88,::std::endl<char,std::char_traits<char>>);
        local_14 = local_14 | 1;
      }
      else {
        in_stack_fffffffffffffd78.mXPathObject = (xmlXPathObjectPtr)local_1b8;
        in_stack_fffffffffffffd80 =
             (string *)
             ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        *(xmlXPathObjectPtr *)in_stack_fffffffffffffd80 = in_stack_fffffffffffffd78.mXPathObject;
      }
      ::std::__cxx11::string::~string(local_180);
      XmlNodeSet::iterator::operator++(&local_128);
    }
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            *)0x18673e);
    XmlNodeSet::iterator::operator++(&local_78);
  }
  return local_14;
}

Assistant:

int DaeValidator::checkUniqueSids(const Dae & dae) const
	{
		cout << "Checking unique sids..." << endl;

		int result = 0;
		const auto & parents = dae.root().selectNodes("//*[@sid]/..");
		for (auto parent : parents)
		{
			const auto & children = parent.selectNodes("*[@sid]");
			map<string, size_t> sids;
			for (auto child : children)
			{
				string sid = child.attribute("sid").value();
				size_t line = child.line();

				auto it = sids.find(sid);
				if (it != sids.end())
				{
					cerr << dae.getURI() << ":" << line << ": Duplicated sid \"" << sid << "\". See first declaration at line " << it->second << "." << endl;
					result |= 1;
				}
				else
				{
					sids[sid] = line;
				}
			}
		}
		return result;
	}